

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager.c
# Opt level: O0

void publish_local_files(apx_fileManager_t *self)

{
  int32_t iVar1;
  rmf_fileInfo_t *file_info_00;
  apx_error_t result;
  rmf_fileInfo_t *file_info;
  int32_t num_files;
  int32_t i;
  adt_ary_t local_file_list;
  apx_fileManager_t *self_local;
  
  local_file_list._40_8_ = self;
  adt_ary_create((adt_ary_t *)&num_files,(_func_void_void_ptr *)0x0);
  iVar1 = apx_fileManagerShared_copy_local_file_info
                    ((apx_fileManagerShared_t *)local_file_list._40_8_,(adt_ary_t *)&num_files);
  for (file_info._4_4_ = 0; file_info._4_4_ < iVar1; file_info._4_4_ = file_info._4_4_ + 1) {
    file_info_00 = (rmf_fileInfo_t *)adt_ary_value((adt_ary_t *)&num_files,file_info._4_4_);
    if (file_info_00 != (rmf_fileInfo_t *)0x0) {
      apx_fileManagerWorker_prepare_publish_local_file
                ((apx_fileManagerWorker_t *)(local_file_list._40_8_ + 0xe0),file_info_00);
    }
  }
  adt_ary_destroy((adt_ary_t *)&num_files);
  return;
}

Assistant:

static void publish_local_files(apx_fileManager_t* self)
{
   adt_ary_t local_file_list;
   int32_t i;
   int32_t num_files;
   adt_ary_create(&local_file_list, NULL);
   num_files = apx_fileManagerShared_copy_local_file_info(&self->shared, &local_file_list);
   for (i=0; i < num_files; i++)
   {
      rmf_fileInfo_t* file_info = (rmf_fileInfo_t*) adt_ary_value(&local_file_list, i);
      if (file_info != NULL)
      {
         //Worker takes memory ownership of file_info
         apx_error_t result = apx_fileManagerWorker_prepare_publish_local_file(&self->worker, file_info);
         if (result != APX_NO_ERROR)
         {
            //TODO: Error handling
         }
      }
   }
   adt_ary_destroy(&local_file_list);
}